

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::computeMinActivity
          (HighsDomain *this,HighsInt start,HighsInt end,HighsInt *ARindex,double *ARvalue,
          HighsInt *ninfmin,HighsCDouble *activitymin)

{
  double coef;
  int iVar1;
  reference lb_00;
  reference ub_00;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  double in_RDI;
  long in_R8;
  int *in_R9;
  HighsCDouble *this_00;
  double *in_stack_00000008;
  double contributionmin_1;
  double val_1;
  HighsInt col_1;
  HighsInt j_1;
  double contributionmin;
  double ub;
  double lb;
  HighsInt tmp;
  double val;
  HighsInt col;
  HighsInt j;
  HighsCDouble *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int iVar2;
  undefined4 in_stack_ffffffffffffff84;
  HighsCDouble local_78;
  double local_68;
  double local_60;
  double local_58 [2];
  double local_48;
  undefined4 local_40;
  int local_3c;
  HighsCDouble local_38;
  int *local_28;
  long local_20;
  long local_18;
  int local_10;
  int local_c;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  if ((*(byte *)((long)in_RDI + 0x280) & 1) == 0) {
    HighsCDouble::HighsCDouble(&local_78,0.0);
    *in_stack_00000008 = local_78.hi;
    in_stack_00000008[1] = local_78.lo;
    *local_28 = 0;
    for (iVar1 = local_c; iVar1 != local_10; iVar1 = iVar1 + 1) {
      iVar2 = *(int *)(local_18 + (long)iVar1 * 4);
      coef = *(double *)(local_20 + (long)iVar1 * 8);
      lb_00 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0x308),
                         (long)iVar2);
      ub_00 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 800),(long)iVar2
                        );
      this_00 = (HighsCDouble *)activityContributionMin(coef,lb_00,ub_00);
      if (((double)this_00 != -INFINITY) || (NAN((double)this_00))) {
        HighsCDouble::operator+=(this_00,in_RDI);
      }
      else {
        *local_28 = *local_28 + 1;
      }
    }
  }
  else {
    HighsCDouble::HighsCDouble(&local_38,0.0);
    *in_stack_00000008 = local_38.hi;
    in_stack_00000008[1] = local_38.lo;
    *local_28 = 0;
    for (local_3c = local_c; local_3c != local_10; local_3c = local_3c + 1) {
      local_40 = *(undefined4 *)(local_18 + (long)local_3c * 4);
      local_48 = *(double *)(local_20 + (long)local_3c * 8);
      local_58[0] = getColLowerPos((HighsDomain *)
                                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                   (HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                                   (HighsInt)in_stack_ffffffffffffff78,
                                   (HighsInt *)in_stack_ffffffffffffff70);
      local_60 = getColUpperPos((HighsDomain *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                                (HighsInt)in_stack_ffffffffffffff78,
                                (HighsInt *)in_stack_ffffffffffffff70);
      local_68 = activityContributionMin(local_48,local_58,&local_60);
      if ((local_68 != -INFINITY) || (NAN(local_68))) {
        HighsCDouble::operator+=(in_stack_ffffffffffffff70,in_RDI);
      }
      else {
        *local_28 = *local_28 + 1;
      }
    }
  }
  HighsCDouble::renormalize((HighsCDouble *)0x5bdd0e);
  return;
}

Assistant:

void HighsDomain::computeMinActivity(HighsInt start, HighsInt end,
                                     const HighsInt* ARindex,
                                     const double* ARvalue, HighsInt& ninfmin,
                                     HighsCDouble& activitymin) {
  if (infeasible_) {
    activitymin = 0.0;
    ninfmin = 0;
    for (HighsInt j = start; j != end; ++j) {
      HighsInt col = ARindex[j];
      double val = ARvalue[j];

      assert(col < int(col_lower_.size()));

      HighsInt tmp;
      double lb = getColLowerPos(col, infeasible_pos - 1, tmp);
      double ub = getColUpperPos(col, infeasible_pos - 1, tmp);
      double contributionmin = activityContributionMin(val, lb, ub);

      if (contributionmin == -kHighsInf)
        ++ninfmin;
      else
        activitymin += contributionmin;
    }

  } else {
    activitymin = 0.0;
    ninfmin = 0;
    for (HighsInt j = start; j != end; ++j) {
      HighsInt col = ARindex[j];
      double val = ARvalue[j];

      assert(col < int(col_lower_.size()));

      double contributionmin =
          activityContributionMin(val, col_lower_[col], col_upper_[col]);

      if (contributionmin == -kHighsInf)
        ++ninfmin;
      else
        activitymin += contributionmin;
    }
  }
  activitymin.renormalize();
}